

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yin_print_refine(lyout *out,int level,lys_module *module,lys_refine *refine)

{
  char *attr_value;
  char *str;
  int content;
  int i;
  lys_refine *refine_local;
  lys_module *module_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  str._0_4_ = 0;
  _content = (lys_node *)refine;
  refine_local = (lys_refine *)module;
  module_local._4_4_ = level;
  plStack_10 = out;
  attr_value = transform_json2xml(module,refine->target_name,0,(char ***)0x0,(char ***)0x0,
                                  (uint32_t *)0x0);
  yin_print_open(plStack_10,module_local._4_4_,(char *)0x0,"refine","target-node",attr_value,
                 (int)str);
  lydict_remove((ly_ctx *)refine_local->target_name,attr_value);
  module_local._4_4_ = module_local._4_4_ + 1;
  yin_print_snode_common
            (plStack_10,module_local._4_4_,_content,(lys_module *)refine_local,(int *)&str,3);
  for (str._4_4_ = 0; str._4_4_ < (int)(uint)_content->padding[2]; str._4_4_ = str._4_4_ + 1) {
    yin_print_close_parent(plStack_10,(int *)&str);
    yin_print_must(plStack_10,module_local._4_4_,(lys_module *)refine_local,
                   (lys_restr *)(*(long *)&_content->nodetype + (long)str._4_4_ * 0x38));
  }
  if ((*(short *)_content->padding == 1) && (_content->child != (lys_node *)0x0)) {
    yin_print_close_parent(plStack_10,(int *)&str);
    yin_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_PRESENCE,'\0',
                      (char *)_content->child,(lys_module *)refine_local,_content->ext,
                      (uint)_content->ext_size);
  }
  for (str._4_4_ = 0; str._4_4_ < (int)(uint)_content->padding[3]; str._4_4_ = str._4_4_ + 1) {
    yin_print_close_parent(plStack_10,(int *)&str);
    yin_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_DEFAULT,(uint8_t)str._4_4_,
                      *(char **)(_content->parent->padding + (long)str._4_4_ * 8 + -0x1c),
                      (lys_module *)refine_local,_content->ext,(uint)_content->ext_size);
  }
  if ((_content->flags & 1) == 0) {
    if ((_content->flags & 2) != 0) {
      yin_print_close_parent(plStack_10,(int *)&str);
      yin_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_CONFIG,'\0',"false",
                        (lys_module *)refine_local,_content->ext,(uint)_content->ext_size);
    }
  }
  else {
    yin_print_close_parent(plStack_10,(int *)&str);
    yin_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_CONFIG,'\0',"true",
                      (lys_module *)refine_local,_content->ext,(uint)_content->ext_size);
  }
  if ((_content->flags & 0x40) == 0) {
    if ((_content->flags & 0x80) != 0) {
      yin_print_close_parent(plStack_10,(int *)&str);
      yin_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_MANDATORY,'\0',"false",
                        (lys_module *)refine_local,_content->ext,(uint)_content->ext_size);
    }
  }
  else {
    yin_print_close_parent(plStack_10,(int *)&str);
    yin_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_MANDATORY,'\0',"true",
                      (lys_module *)refine_local,_content->ext,(uint)_content->ext_size);
  }
  if ((*(ushort *)_content->padding & 0x18) != 0) {
    if ((_content->flags & 0x10) != 0) {
      yin_print_close_parent(plStack_10,(int *)&str);
      yin_print_unsigned(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_MIN,'\0',
                         (lys_module *)refine_local,_content->ext,(uint)_content->ext_size,
                         *(uint *)&_content->child);
    }
    if ((_content->flags & 8) != 0) {
      yin_print_close_parent(plStack_10,(int *)&str);
      if (*(int *)((long)&_content->child + 4) == 0) {
        yin_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_MAX,'\0',"unbounded",
                          (lys_module *)refine_local,_content->ext,(uint)_content->ext_size);
      }
      else {
        yin_print_unsigned(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_MAX,'\0',
                           (lys_module *)refine_local,_content->ext,(uint)_content->ext_size,
                           *(uint *)((long)&_content->child + 4));
      }
    }
  }
  yin_print_snode_common
            (plStack_10,module_local._4_4_,_content,(lys_module *)refine_local,(int *)&str,0x60);
  module_local._4_4_ = module_local._4_4_ + -1;
  yin_print_close(plStack_10,module_local._4_4_,(char *)0x0,"refine",(int)str);
  return;
}

Assistant:

static void
yin_print_refine(struct lyout *out, int level, const struct lys_module *module, const struct lys_refine *refine)
{
    int i, content = 0;
    const char *str;

    str = transform_json2xml(module, refine->target_name, 0, NULL, NULL, NULL);
    yin_print_open(out, level, NULL, "refine", "target-node", str, content);
    lydict_remove(module->ctx, str);

    level++;
    yin_print_snode_common(out, level, (struct lys_node *)refine, module, &content,
                           SNODE_COMMON_EXT | SNODE_COMMON_IFF);
    for (i = 0; i < refine->must_size; ++i) {
        yin_print_close_parent(out, &content);
        yin_print_must(out, level, module, &refine->must[i]);
    }
    if (refine->target_type == LYS_CONTAINER && refine->mod.presence) {
        yin_print_close_parent(out, &content);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_PRESENCE, 0, refine->mod.presence,
                          module, refine->ext, refine->ext_size);
    }
    for (i = 0; i < refine->dflt_size; ++i) {
        yin_print_close_parent(out, &content);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_DEFAULT, i, refine->dflt[i],
                          module, refine->ext, refine->ext_size);
    }
    if (refine->flags & LYS_CONFIG_W) {
        yin_print_close_parent(out, &content);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_CONFIG, 0, "true", module, refine->ext, refine->ext_size);
    } else if (refine->flags & LYS_CONFIG_R) {
        yin_print_close_parent(out, &content);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_CONFIG, 0, "false", module, refine->ext, refine->ext_size);
    }
    if (refine->flags & LYS_MAND_TRUE) {
        yin_print_close_parent(out, &content);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_MANDATORY, 0, "true", module, refine->ext, refine->ext_size);
    } else if (refine->flags & LYS_MAND_FALSE) {
        yin_print_close_parent(out, &content);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_MANDATORY, 0, "false", module, refine->ext, refine->ext_size);
    }
    if (refine->target_type & (LYS_LIST | LYS_LEAFLIST)) {
        if (refine->flags & LYS_RFN_MINSET) {
            yin_print_close_parent(out, &content);
            yin_print_unsigned(out, level, LYEXT_SUBSTMT_MIN, 0, module, refine->ext, refine->ext_size,
                               refine->mod.list.min);
        }
        if (refine->flags & LYS_RFN_MAXSET) {
            yin_print_close_parent(out, &content);
            if (refine->mod.list.max) {
                yin_print_unsigned(out, level, LYEXT_SUBSTMT_MAX, 0, module, refine->ext, refine->ext_size,
                                   refine->mod.list.max);
            } else {
                yin_print_substmt(out, level, LYEXT_SUBSTMT_MAX, 0, "unbounded", module,
                                  refine->ext, refine->ext_size);
            }
        }
    }
    yin_print_snode_common(out, level, (struct lys_node *)refine, module, &content,
                           SNODE_COMMON_DSC | SNODE_COMMON_REF);
    level--;

    yin_print_close(out, level, NULL, "refine", content);
}